

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Base64.cc
# Opt level: O0

void __thiscall Pl_Base64::encode(Pl_Base64 *this,uchar *data,size_t len)

{
  uchar uVar1;
  size_t sVar2;
  uchar *local_28;
  uchar *p;
  size_t len_local;
  uchar *data_local;
  Pl_Base64 *this_local;
  
  local_28 = data;
  for (p = (uchar *)len; p != (uchar *)0x0; p = p + -1) {
    uVar1 = *local_28;
    sVar2 = this->pos;
    this->pos = sVar2 + 1;
    this->buf[sVar2] = uVar1;
    if (this->pos == 3) {
      flush(this);
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void
Pl_Base64::encode(unsigned char const* data, size_t len)
{
    unsigned char const* p = data;
    while (len > 0) {
        this->buf[this->pos++] = *p;
        if (this->pos == 3) {
            flush();
        }
        ++p;
        --len;
    }
}